

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

bool __thiscall
icu_63::number::impl::DecimalQuantity::operator==(DecimalQuantity *this,DecimalQuantity *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int8_t iVar4;
  int8_t iVar5;
  int iVar6;
  int magnitude;
  int iVar7;
  bool bVar8;
  
  iVar1 = this->scale;
  if (((((iVar1 == other->scale) && (iVar6 = this->precision, iVar6 == other->precision)) &&
       (this->flags == other->flags)) &&
      ((magnitude = this->lOptPos, magnitude == other->lOptPos &&
       (iVar2 = this->lReqPos, iVar2 == other->lReqPos)))) &&
     ((iVar3 = this->rReqPos, iVar3 == other->rReqPos &&
      ((iVar7 = this->rOptPos, iVar7 == other->rOptPos &&
       (this->isApproximate == other->isApproximate)))))) {
    if (iVar6 == 0) {
      bVar8 = true;
    }
    else if (this->isApproximate == '\0') {
      iVar6 = iVar6 + iVar1;
      if (iVar6 <= magnitude) {
        magnitude = iVar6;
      }
      if (iVar6 < iVar2) {
        magnitude = iVar2;
      }
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
      if (iVar3 < iVar1) {
        iVar7 = iVar3;
      }
      do {
        bVar8 = magnitude <= iVar7;
        if (magnitude <= iVar7) {
          return bVar8;
        }
        magnitude = magnitude + -1;
        iVar4 = getDigit(this,magnitude);
        iVar5 = getDigit(other,magnitude);
      } while (iVar4 == iVar5);
    }
    else {
      bVar8 = this->origDelta == other->origDelta && this->origDouble == other->origDouble;
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool DecimalQuantity::operator==(const DecimalQuantity& other) const {
    bool basicEquals =
            scale == other.scale
            && precision == other.precision
            && flags == other.flags
            && lOptPos == other.lOptPos
            && lReqPos == other.lReqPos
            && rReqPos == other.rReqPos
            && rOptPos == other.rOptPos
            && isApproximate == other.isApproximate;
    if (!basicEquals) {
        return false;
    }

    if (precision == 0) {
        return true;
    } else if (isApproximate) {
        return origDouble == other.origDouble && origDelta == other.origDelta;
    } else {
        for (int m = getUpperDisplayMagnitude(); m >= getLowerDisplayMagnitude(); m--) {
            if (getDigit(m) != other.getDigit(m)) {
                return false;
            }
        }
        return true;
    }
}